

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::StandardBufferManager::Allocate
          (BufferHandle *__return_storage_ptr__,StandardBufferManager *this,MemoryTag tag,
          idx_t block_size,bool can_destroy)

{
  undefined7 in_register_00000011;
  shared_ptr<duckdb::BlockHandle,_true> block;
  
  AllocateTemporaryMemory
            ((StandardBufferManager *)&stack0xffffffffffffffd8,(MemoryTag)this,
             CONCAT71(in_register_00000011,tag),SUB81(block_size,0));
  Pin(__return_storage_ptr__,this,(shared_ptr<duckdb::BlockHandle,_true> *)&stack0xffffffffffffffd8)
  ;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

BufferHandle StandardBufferManager::Allocate(MemoryTag tag, idx_t block_size, bool can_destroy) {
	auto block = AllocateTemporaryMemory(tag, block_size, can_destroy);

#ifdef DUCKDB_DEBUG_DESTROY_BLOCKS
	// Initialize the memory with garbage data
	WriteGarbageIntoBuffer(*block);
#endif
	return Pin(block);
}